

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonValidFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  JsonParse *pJVar3;
  undefined8 *in_RDX;
  u32 in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  u32 iErr;
  i64 f;
  u8 res;
  u8 flags;
  JsonParse *p;
  JsonParse px_1;
  JsonParse px;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  u32 in_stack_ffffffffffffff34;
  sqlite3_value *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 uVar4;
  byte bVar5;
  undefined4 in_stack_ffffffffffffff68;
  u32 in_stack_ffffffffffffff6c;
  sqlite3_value *in_stack_ffffffffffffff70;
  sqlite3_context *in_stack_ffffffffffffff78;
  void *local_50;
  int local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = 1;
  uVar4 = 0;
  if (in_ESI == 2) {
    in_stack_ffffffffffffff38 = (sqlite3_value *)sqlite3_value_int64((sqlite3_value *)0x230958);
    if (((long)in_stack_ffffffffffffff38 < 1) || (0xf < (long)in_stack_ffffffffffffff38)) {
      sqlite3_result_error
                ((sqlite3_context *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),0);
      goto LAB_00230b60;
    }
    bVar5 = (byte)in_stack_ffffffffffffff38 & 0xf;
  }
  iVar1 = sqlite3_value_type((sqlite3_value *)*in_RDX);
  if (iVar1 == 4) {
    iVar2 = jsonFuncArgMightBeBinary
                      ((sqlite3_value *)CONCAT17(bVar5,CONCAT16(uVar4,in_stack_ffffffffffffff40)));
    if (iVar2 == 0) goto LAB_00230a96;
    if (((bVar5 & 4) == 0) && ((bVar5 & 8) != 0)) {
      memset(&local_50,0xaa,0x48);
      memset(&local_50,0,0x48);
      local_50 = sqlite3_value_blob(in_stack_ffffffffffffff38);
      local_48 = sqlite3_value_bytes((sqlite3_value *)0x230a56);
      in_stack_ffffffffffffff34 =
           jsonbValidityCheck((JsonParse *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                              (u32)((ulong)in_RDI >> 0x20),(u32)in_RDI,in_ESI);
    }
  }
  else {
    if (iVar1 == 5) goto LAB_00230b60;
LAB_00230a96:
    memset(&stack0xffffffffffffff68,0xaa,0x48);
    if ((bVar5 & 3) != 0) {
      memset(&stack0xffffffffffffff68,0,0x48);
      pJVar3 = jsonParseFuncArg(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                in_stack_ffffffffffffff6c);
      if (pJVar3 == (JsonParse *)0x0) {
        sqlite3_result_error_nomem((sqlite3_context *)0x230b4f);
      }
      else {
        if (pJVar3->oom != '\0') {
          sqlite3_result_error_nomem((sqlite3_context *)0x230b06);
        }
        jsonParseFree((JsonParse *)0x230b43);
      }
    }
  }
  sqlite3_result_int((sqlite3_context *)CONCAT44(in_stack_ffffffffffffff34,iVar1),
                     in_stack_ffffffffffffff2c);
LAB_00230b60:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonValidFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  u8 flags = 1;
  u8 res = 0;
  if( argc==2 ){
    i64 f = sqlite3_value_int64(argv[1]);
    if( f<1 || f>15 ){
      sqlite3_result_error(ctx, "FLAGS parameter to json_valid() must be"
                                " between 1 and 15", -1);
      return;
    }
    flags = f & 0x0f;
  }
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_NULL: {
#ifdef SQLITE_LEGACY_JSON_VALID
      /* Incorrect legacy behavior was to return FALSE for a NULL input */
      sqlite3_result_int(ctx, 0);
#endif
      return;
    }
    case SQLITE_BLOB: {
      if( jsonFuncArgMightBeBinary(argv[0]) ){
        if( flags & 0x04 ){
          /* Superficial checking only - accomplished by the
          ** jsonFuncArgMightBeBinary() call above. */
          res = 1;
        }else if( flags & 0x08 ){
          /* Strict checking.  Check by translating BLOB->TEXT->BLOB.  If
          ** no errors occur, call that a "strict check". */
          JsonParse px;
          u32 iErr;
          memset(&px, 0, sizeof(px));
          px.aBlob = (u8*)sqlite3_value_blob(argv[0]);
          px.nBlob = sqlite3_value_bytes(argv[0]);
          iErr = jsonbValidityCheck(&px, 0, px.nBlob, 1);
          res = iErr==0;
        }
        break;
      }
      /* Fall through into interpreting the input as text.  See note
      ** above at tag-20240123-a. */
      /* no break */ deliberate_fall_through
    }
    default: {
      JsonParse px;
      if( (flags & 0x3)==0 ) break;
      memset(&px, 0, sizeof(px));

      p = jsonParseFuncArg(ctx, argv[0], JSON_KEEPERROR);
      if( p ){
        if( p->oom ){
          sqlite3_result_error_nomem(ctx);
        }else if( p->nErr ){
          /* no-op */
        }else if( (flags & 0x02)!=0 || p->hasNonstd==0 ){
          res = 1;
        }
        jsonParseFree(p);
      }else{
        sqlite3_result_error_nomem(ctx);
      }
      break;
    }
  }
  sqlite3_result_int(ctx, res);
}